

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O1

double __thiscall
TasGrid::GridLocalPolynomial::evalBasisSupported<(TasGrid::RuleLocal::erule)1>
          (GridLocalPolynomial *this,int *point,double *x,bool *isSupported)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)1>(this->order,*point,*x,isSupported);
  dVar6 = 0.0;
  if (*isSupported == true) {
    iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
    bVar2 = 1 < iVar1;
    if (1 < iVar1) {
      dVar6 = RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)1>
                        (this->order,point[1],x[1],isSupported);
      dVar5 = dVar5 * dVar6;
      if (*isSupported == true) {
        lVar4 = 2;
        do {
          lVar3 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
          bVar2 = lVar4 < lVar3;
          if (lVar3 <= lVar4) break;
          dVar6 = RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)1>
                            (this->order,point[lVar4],x[lVar4],isSupported);
          dVar5 = dVar5 * dVar6;
          lVar4 = lVar4 + 1;
        } while (*isSupported != false);
      }
    }
    dVar6 = 0.0;
    if (!bVar2) {
      dVar6 = dVar5;
    }
  }
  return dVar6;
}

Assistant:

double evalBasisSupported(const int point[], const double x[], bool &isSupported) const{
        double f = RuleLocal::evalSupport<eff_rule>(order, point[0], x[0], isSupported);
        if (!isSupported) return 0.0;
        for(int j=1; j<num_dimensions; j++){
            f *= RuleLocal::evalSupport<eff_rule>(order, point[j], x[j], isSupported);
            if (!isSupported) return 0.0;
        }
        return f;
    }